

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::num_tag_directives(Tree *this)

{
  size_t sVar1;
  size_t *psVar2;
  
  psVar2 = &this->m_tag_directives[0].handle.len;
  sVar1 = 0;
  while( true ) {
    if (*psVar2 == 0) {
      return sVar1;
    }
    if (((csubstr *)(psVar2 + -1))->str == (char *)0x0) break;
    sVar1 = sVar1 + 1;
    psVar2 = psVar2 + 5;
    if (sVar1 == 4) {
      return 4;
    }
  }
  return sVar1;
}

Assistant:

size_t Tree::num_tag_directives() const
{
    // this assumes we have a very small number of tag directives
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        if(m_tag_directives[i].handle.empty())
            return i;
    return RYML_MAX_TAG_DIRECTIVES;
}